

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

uint rlLoadTexture(void *data,int width,int height,int format,int mipmapCount)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  int width_00;
  void *pvVar7;
  uint id;
  uint local_68;
  uint local_64;
  int local_60;
  uint glType;
  uint glFormat;
  uint glInternalFormat;
  void *local_50;
  GLint swizzleMask [4];
  
  uVar1 = (ulong)(uint)width;
  id = 0;
  local_50 = data;
  (*glad_glBindTexture)(0xde1,0);
  if ((format - 0x12U < 0xfffffffc) || (RLGL.ExtSupported.texCompDXT != false)) {
    if ((format == 0x12) && (RLGL.ExtSupported.texCompETC1 == false)) {
      pcVar6 = "GL: ETC1 compressed texture format not supported";
    }
    else if ((format - 0x15U < 0xfffffffe) || (RLGL.ExtSupported.texCompETC2 != false)) {
      if ((format - 0x17U < 0xfffffffe) || (RLGL.ExtSupported.texCompPVRT != false)) {
        if ((format - 0x19U < 0xfffffffe) || (RLGL.ExtSupported.texCompASTC != false)) {
          (*glad_glPixelStorei)(0xcf5,1);
          (*glad_glGenTextures)(1,&id);
          (*glad_glBindTexture)(0xde1,id);
          iVar5 = 0;
          local_60 = 0;
          pvVar7 = local_50;
          local_68 = width;
          local_64 = height;
          if (0 < mipmapCount) {
            local_60 = mipmapCount;
          }
          for (; local_60 != iVar5; iVar5 = iVar5 + 1) {
            width_00 = (int)uVar1;
            uVar3 = rlGetPixelDataSize(width_00,height,format);
            uVar4 = (ulong)uVar3;
            rlGetGlTextureFormats(format,&glInternalFormat,&glFormat,&glType);
            if (glInternalFormat != 0) {
              if (format < 0xe) {
                (*glad_glTexImage2D)
                          (0xde1,iVar5,glInternalFormat,width_00,height,0,glFormat,glType,pvVar7);
              }
              else {
                (*glad_glCompressedTexImage2D)
                          (0xde1,iVar5,glInternalFormat,width_00,height,0,uVar3,pvVar7);
              }
              if (format == 2) {
                swizzleMask[3] = 0x1904;
              }
              else {
                if (format != 1) goto LAB_00112bbb;
                swizzleMask[3] = 1;
              }
              swizzleMask[0] = 0x1903;
              swizzleMask[1] = 0x1903;
              swizzleMask[2] = 0x1903;
              (*glad_glTexParameteriv)(0xde1,0x8e46,swizzleMask);
            }
LAB_00112bbb:
            uVar1 = (long)((ulong)(uint)(width_00 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2;
            height = height / 2;
            if (local_50 == (void *)0x0) {
              uVar4 = 0;
            }
            if ((int)uVar1 < 2) {
              uVar1 = 1;
            }
            if (height < 2) {
              height = 1;
            }
            pvVar7 = (void *)((long)pvVar7 + uVar4);
          }
          (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
          (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
          (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
          (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
          if (1 < mipmapCount) {
            (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
            (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
          }
          (*glad_glBindTexture)(0xde1,0);
          uVar2 = local_64;
          uVar3 = id;
          if (id != 0) {
            pcVar6 = rlGetPixelFormatName(format);
            TraceLog(3,"TEXTURE: [ID %i] Texture loaded successfully (%ix%i | %s | %i mipmaps)",
                     (ulong)uVar3,(ulong)local_68,(ulong)uVar2,pcVar6,(ulong)(uint)mipmapCount);
            return id;
          }
          pcVar6 = "TEXTURE: Failed to load texture";
        }
        else {
          pcVar6 = "GL: ASTC compressed texture format not supported";
        }
      }
      else {
        pcVar6 = "GL: PVRT compressed texture format not supported";
      }
    }
    else {
      pcVar6 = "GL: ETC2 compressed texture format not supported";
    }
  }
  else {
    pcVar6 = "GL: DXT compressed texture format not supported";
  }
  TraceLog(4,pcVar6);
  return id;
}

Assistant:

unsigned int rlLoadTexture(const void *data, int width, int height, int format, int mipmapCount)
{
    unsigned int id = 0;

    glBindTexture(GL_TEXTURE_2D, 0);    // Free any old binding

    // Check texture format support by OpenGL 1.1 (compressed textures not supported)
#if defined(GRAPHICS_API_OPENGL_11)
    if (format >= RL_PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(RL_LOG_WARNING, "GL: OpenGL 1.1 does not support GPU compressed texture formats");
        return id;
    }
#else
    if ((!RLGL.ExtSupported.texCompDXT) && ((format == RL_PIXELFORMAT_COMPRESSED_DXT1_RGB) || (format == RL_PIXELFORMAT_COMPRESSED_DXT1_RGBA) ||
        (format == RL_PIXELFORMAT_COMPRESSED_DXT3_RGBA) || (format == RL_PIXELFORMAT_COMPRESSED_DXT5_RGBA)))
    {
        TRACELOG(RL_LOG_WARNING, "GL: DXT compressed texture format not supported");
        return id;
    }
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if ((!RLGL.ExtSupported.texCompETC1) && (format == RL_PIXELFORMAT_COMPRESSED_ETC1_RGB))
    {
        TRACELOG(RL_LOG_WARNING, "GL: ETC1 compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompETC2) && ((format == RL_PIXELFORMAT_COMPRESSED_ETC2_RGB) || (format == RL_PIXELFORMAT_COMPRESSED_ETC2_EAC_RGBA)))
    {
        TRACELOG(RL_LOG_WARNING, "GL: ETC2 compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompPVRT) && ((format == RL_PIXELFORMAT_COMPRESSED_PVRT_RGB) || (format == RL_PIXELFORMAT_COMPRESSED_PVRT_RGBA)))
    {
        TRACELOG(RL_LOG_WARNING, "GL: PVRT compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompASTC) && ((format == RL_PIXELFORMAT_COMPRESSED_ASTC_4x4_RGBA) || (format == RL_PIXELFORMAT_COMPRESSED_ASTC_8x8_RGBA)))
    {
        TRACELOG(RL_LOG_WARNING, "GL: ASTC compressed texture format not supported");
        return id;
    }
#endif
#endif  // GRAPHICS_API_OPENGL_11

    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

    glGenTextures(1, &id);              // Generate texture id

    glBindTexture(GL_TEXTURE_2D, id);

    int mipWidth = width;
    int mipHeight = height;
    int mipOffset = 0;          // Mipmap data offset, only used for tracelog

    // NOTE: Added pointer math separately from function to avoid UBSAN complaining
    unsigned char *dataPtr = NULL;
    if (data != NULL) dataPtr = (unsigned char *)data;

    // Load the different mipmap levels
    for (int i = 0; i < mipmapCount; i++)
    {
        unsigned int mipSize = rlGetPixelDataSize(mipWidth, mipHeight, format);

        unsigned int glInternalFormat, glFormat, glType;
        rlGetGlTextureFormats(format, &glInternalFormat, &glFormat, &glType);

        TRACELOGD("TEXTURE: Load mipmap level %i (%i x %i), size: %i, offset: %i", i, mipWidth, mipHeight, mipSize, mipOffset);

        if (glInternalFormat != 0)
        {
            if (format < RL_PIXELFORMAT_COMPRESSED_DXT1_RGB) glTexImage2D(GL_TEXTURE_2D, i, glInternalFormat, mipWidth, mipHeight, 0, glFormat, glType, dataPtr);
#if !defined(GRAPHICS_API_OPENGL_11)
            else glCompressedTexImage2D(GL_TEXTURE_2D, i, glInternalFormat, mipWidth, mipHeight, 0, mipSize, dataPtr);
#endif

#if defined(GRAPHICS_API_OPENGL_33)
            if (format == RL_PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
            {
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
            else if (format == RL_PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA)
            {
#if defined(GRAPHICS_API_OPENGL_21)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ALPHA };
#elif defined(GRAPHICS_API_OPENGL_33)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
#endif
                glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
#endif
        }

        mipWidth /= 2;
        mipHeight /= 2;
        mipOffset += mipSize;       // Increment offset position to next mipmap
        if (data != NULL) dataPtr += mipSize;         // Increment data pointer to next mipmap

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;
    }

    // Texture parameters configuration
    // NOTE: glTexParameteri does NOT affect texture uploading, just the way it's used
#if defined(GRAPHICS_API_OPENGL_ES2)
    // NOTE: OpenGL ES 2.0 with no GL_OES_texture_npot support (i.e. WebGL) has limited NPOT support, so CLAMP_TO_EDGE must be used
    if (RLGL.ExtSupported.texNPOT)
    {
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
    }
    else
    {
        // NOTE: If using negative texture coordinates (LoadOBJ()), it does not work!
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);       // Set texture to clamp on x-axis
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);       // Set texture to clamp on y-axis
    }
#else
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
#endif

    // Magnification and minification filters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR

#if defined(GRAPHICS_API_OPENGL_33)
    if (mipmapCount > 1)
    {
        // Activate Trilinear filtering if mipmaps are available
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    }
#endif

    // At this point we have the texture loaded in GPU and texture parameters configured

    // NOTE: If mipmaps were not in data, they are not generated automatically

    // Unbind current texture
    glBindTexture(GL_TEXTURE_2D, 0);

    if (id > 0) TRACELOG(RL_LOG_INFO, "TEXTURE: [ID %i] Texture loaded successfully (%ix%i | %s | %i mipmaps)", id, width, height, rlGetPixelFormatName(format), mipmapCount);
    else TRACELOG(RL_LOG_WARNING, "TEXTURE: Failed to load texture");

    return id;
}